

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_set_load_balancer_status(void)

{
  code *pcVar1;
  char *__s;
  SlbSetLoadBalancerStatusRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1b1;
  int ret;
  HttpTestListener *local_190;
  HttpTestListener *listener;
  string local_180;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  SlbSetLoadBalancerStatusRequestType *local_d8;
  Slb *slb;
  undefined1 local_c8 [7];
  SlbSetLoadBalancerStatusResponseType resp;
  SlbSetLoadBalancerStatusRequestType req;
  
  aliyun::SlbSetLoadBalancerStatusRequestType::SlbSetLoadBalancerStatusRequestType
            ((SlbSetLoadBalancerStatusRequestType *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"cn-hangzhou",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_appid",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"my_secret",&local_159);
  pSVar2 = (SlbSetLoadBalancerStatusRequestType *)
           aliyun::Slb::CreateSlbClient(local_f8,local_130,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = pSVar2;
  if (pSVar2 == (SlbSetLoadBalancerStatusRequestType *)0x0) {
    aliyun::SlbSetLoadBalancerStatusRequestType::~SlbSetLoadBalancerStatusRequestType
              ((SlbSetLoadBalancerStatusRequestType *)local_c8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_d8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_load_balancer_status_response;
  local_190 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1b1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1b1);
  HttpTestListener::Start(local_190);
  std::__cxx11::string::operator=((string *)local_c8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"LoadBalancerStatus");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_status.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::SetLoadBalancerStatus
            (local_d8,(SlbSetLoadBalancerStatusResponseType *)local_c8,
             (SlbErrorInfo *)((long)&slb + 7));
  HttpTestListener::WaitComplete(local_190);
  pHVar3 = local_190;
  if (local_190 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_190);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_d8;
  if (local_d8 != (SlbSetLoadBalancerStatusRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_d8);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_load_balancer_status() {
  SlbSetLoadBalancerStatusRequestType req;
  SlbSetLoadBalancerStatusResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_load_balancer_status_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.load_balancer_status = "LoadBalancerStatus";
  req.owner_account = "OwnerAccount";
  int ret = slb->SetLoadBalancerStatus(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}